

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O1

void __thiscall libtorrent::upnp::on_reply(upnp *this,socket_package *s,error_code *ec,size_t len)

{
  session_settings *psVar1;
  pointer pcVar2;
  portmap_callback *ppVar3;
  pointer pgVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  _WordT _Var7;
  bool bVar8;
  int iVar9;
  string *psVar10;
  iterator iVar11;
  endpoint *ep;
  endpoint *ep_00;
  endpoint *ep_01;
  endpoint *ep_02;
  endpoint *ep_03;
  endpoint *ep_04;
  endpoint *ep_05;
  endpoint *ep_06;
  pointer pgVar12;
  ulong *puVar13;
  error_code *ec_00;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  span<const_char> recv_buffer;
  string_view key;
  string_view url_00;
  bool error;
  endpoint from;
  string protocol;
  mapping_t m;
  string auth;
  string url;
  rootdevice d;
  error_code err;
  scope_end_impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_upnp_cpp:481:35)>
  reissue_receive;
  shared_ptr<libtorrent::upnp> me;
  http_parser p;
  undefined1 local_3b9;
  ulong local_3b8;
  undefined4 uStack_3b0;
  undefined4 local_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  uint uStack_3a0;
  undefined1 *local_390;
  undefined8 local_388;
  undefined1 local_380;
  undefined7 uStack_37f;
  undefined1 local_370 [12];
  int iStack_364;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_360;
  _Head_base<3UL,_int,_false> _Stack_350;
  undefined4 uStack_34c;
  _Alloc_hider _Stack_348;
  _Alloc_hider local_340;
  undefined1 local_338 [24];
  int local_320;
  undefined1 local_2e8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  undefined1 **local_2d0;
  undefined1 **local_2c8;
  undefined1 *local_2c0;
  undefined8 local_2b8;
  undefined1 local_2b0;
  undefined7 uStack_2af;
  ulong *local_2a0;
  long local_298;
  ulong local_290 [2];
  undefined1 local_280 [16];
  undefined1 auStack_270 [24];
  _Alloc_hider local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  undefined8 local_240;
  _Alloc_hider local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_> local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  undefined1 local_1e8 [8];
  undefined1 local_1e0 [32];
  _Base_ptr local_1c0;
  anon_union_16_3_a3f0114d_for___in6_u aStack_1b8;
  unsigned_long uStack_1a8;
  undefined2 local_1a0;
  bool local_19e;
  element_type *local_198;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_190;
  uint local_188;
  char local_184;
  system_error_category *local_180;
  scope_end_impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_upnp_cpp:481:35)>
  local_178;
  __shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2> local_160 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_158;
  undefined1 local_150 [8];
  undefined1 local_148 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138 [14];
  int local_50;
  anon_enum_32 local_3c;
  
  if ((ec->val_ == 0x7d) && (ec->cat_->id_ == 0x8fafd21e25c5e09b)) {
    return;
  }
  if (this->m_closing != false) {
    return;
  }
  ::std::__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::upnp,void>
            (local_160,(__weak_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_3b8 = *(ulong *)&(s->remote).impl_.data_;
  uVar5 = *(undefined8 *)((long)&(s->remote).impl_.data_ + 8);
  uVar6 = *(undefined8 *)((long)&(s->remote).impl_.data_ + 0x14);
  uStack_3a8 = (undefined4)((ulong)*(undefined8 *)((long)&(s->remote).impl_.data_ + 0xc) >> 0x20);
  uStack_3a4 = (undefined4)uVar6;
  uStack_3a0 = (uint)((ulong)uVar6 >> 0x20);
  uStack_3b0 = (undefined4)uVar5;
  local_3ac = (undefined4)((ulong)uVar5 >> 0x20);
  local_178.m_armed = true;
  local_178.m_fun.s = s;
  local_178.m_fun.this = this;
  if (ec->failed_ != false) goto LAB_0038f172;
  psVar1 = this->m_settings;
  local_2e8 = (undefined1  [8])&psVar1->m_mutex;
  p_Stack_2e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((ulong)p_Stack_2e0 & 0xffffffffffffff00);
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_2e8);
  p_Stack_2e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(p_Stack_2e0._1_7_,1);
  _Var7 = (psVar1->m_store).m_bools.super__Base_bitset<2UL>._M_w[0];
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_2e8);
  if ((_Var7 & 0x20) != 0) {
    local_150._0_4_ = ipv4;
    local_150._4_4_ = (this->m_listen_address).addr_.s_addr;
    local_148._0_8_ = 0;
    local_148._8_8_ = 0;
    local_138[0]._M_allocated_capacity = 0;
    if ((short)local_3b8 == 2) {
      local_280._0_8_ = local_3b8 & 0xffffffff00000000;
      local_280._8_8_ = (aux *)0x0;
      auStack_270._0_8_ = 0;
      auStack_270._8_8_ = 0;
    }
    else {
      local_280._8_8_ = CONCAT44(local_3ac,uStack_3b0);
      auStack_270._0_8_ = CONCAT44(uStack_3a4,uStack_3a8);
      auStack_270._8_8_ = ZEXT48(uStack_3a0);
      local_280._0_8_ = (ulong *)0x1;
    }
    local_370._0_8_ = (ulong)(this->m_netmask).addr_.s_addr << 0x20;
    stack0xfffffffffffffc98 = 0;
    aStack_360._M_allocated_capacity._0_4_ = 0;
    aStack_360._M_allocated_capacity._4_4_ = 0;
    aStack_360._8_4_ = 0;
    aStack_360._12_4_ = 0;
    bVar8 = aux::match_addr_mask((address *)local_150,(address *)local_280,(address *)local_370);
    if (!bVar8) {
      iVar9 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
      if ((char)iVar9 != '\0') {
        aux::print_endpoint_abi_cxx11_((string *)local_150,(aux *)&local_3b8,ep_01);
        boost::asio::ip::address_v4::to_string_abi_cxx11_
                  ((string *)local_280,&this->m_listen_address);
        boost::asio::ip::address_v4::to_string_abi_cxx11_((string *)local_370,&this->m_netmask);
        log(this,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._0_8_ != &aStack_360) {
          operator_delete((void *)local_370._0_8_,
                          CONCAT44(aStack_360._M_allocated_capacity._4_4_,
                                   aStack_360._M_allocated_capacity._0_4_) + 1);
        }
        if ((undefined1 *)local_280._0_8_ != auStack_270) {
          operator_delete((void *)local_280._0_8_,auStack_270._0_8_ + 1);
        }
        if ((undefined1 *)CONCAT44(local_150._4_4_,local_150._0_4_) != local_148 + 8) {
          operator_delete((undefined1 *)CONCAT44(local_150._4_4_,local_150._0_4_),
                          local_148._8_8_ + 1);
        }
      }
      goto LAB_0038f172;
    }
  }
  aux::http_parser::http_parser((http_parser *)local_150,0);
  ec_00 = (error_code *)&local_3b9;
  local_3b9 = '\0';
  recv_buffer.m_len = (difference_type)&s->buffer;
  recv_buffer.m_ptr = local_150;
  aux::http_parser::incoming((http_parser *)local_280,recv_buffer,(bool *)len);
  if (local_3b9 == '\x01') {
    iVar9 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
    if ((char)iVar9 != '\0') {
      aux::print_endpoint_abi_cxx11_((string *)local_280,(aux *)&local_3b8,ep);
      log(this,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
LAB_0038f069:
      local_290[0] = auStack_270._0_8_;
      puVar13 = (ulong *)local_280._0_8_;
      if ((undefined1 *)local_280._0_8_ != auStack_270) {
LAB_0038f15d:
        operator_delete(puVar13,local_290[0] + 1);
      }
    }
  }
  else if ((local_50 == 200) || (iVar9 = ::std::__cxx11::string::compare(local_148), iVar9 == 0)) {
    if (local_3c == read_body) {
      key._M_str = "location";
      key._M_len = 8;
      psVar10 = aux::http_parser::header_abi_cxx11_((http_parser *)local_150,key);
      local_2a0 = local_290;
      pcVar2 = (psVar10->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2a0,pcVar2,pcVar2 + psVar10->_M_string_length);
      if (local_298 == 0) {
        iVar9 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
        if ((char)iVar9 != '\0') {
          aux::print_endpoint_abi_cxx11_((string *)local_280,(aux *)&local_3b8,ep_03);
          log(this,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
          if ((undefined1 *)local_280._0_8_ != auStack_270) {
            operator_delete((void *)local_280._0_8_,auStack_270._0_8_ + 1);
          }
        }
      }
      else {
        local_280._0_8_ = auStack_270;
        local_280._8_8_ = (aux *)0x0;
        auStack_270._0_8_ = auStack_270._0_8_ & 0xffffffffffffff00;
        auStack_270._16_8_ = &local_250;
        local_258._M_p = (pointer)0x0;
        local_250._M_local_buf[0] = '\0';
        local_240 = &local_230;
        local_238._M_p = (pointer)0x0;
        local_230._M_local_buf[0] = '\0';
        local_220.
        super__Vector_base<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_220.
        super__Vector_base<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_220.
        super__Vector_base<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_208._M_allocated_capacity = (size_type)&local_1f8;
        local_208._8_8_ = 0;
        local_1f8._M_local_buf[0] = '\0';
        local_1e8._0_4_ = 0;
        local_1e0._0_8_ = local_1e0 + 0x10;
        local_1e0._8_8_ = 0;
        local_1e0[0x10] = '\0';
        local_1c0 = (_Base_ptr)0x0;
        aStack_1b8._0_8_ = 0;
        aStack_1b8._8_8_ = (char *)0x0;
        uStack_1a8 = 0;
        local_1a0._0_1_ = true;
        local_1a0._1_1_ = true;
        local_19e = false;
        local_198 = (element_type *)0x0;
        _Stack_190._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ::std::__cxx11::string::_M_assign((string *)local_280);
        iVar11 = ::std::
                 _Rb_tree<libtorrent::upnp::rootdevice,_libtorrent::upnp::rootdevice,_std::_Identity<libtorrent::upnp::rootdevice>,_std::less<libtorrent::upnp::rootdevice>,_std::allocator<libtorrent::upnp::rootdevice>_>
                 ::find(&(this->m_devices)._M_t,(key_type *)local_280);
        if ((_Rb_tree_header *)iVar11._M_node ==
            &(this->m_devices)._M_t._M_impl.super__Rb_tree_header) {
          local_388 = 0;
          local_380 = 0;
          local_2c0 = &local_2b0;
          local_2b8 = 0;
          local_2b0 = 0;
          local_188 = 0;
          local_184 = '\0';
          local_180 = &boost::system::detail::cat_holder<void>::system_category_instance;
          url_00._M_str = (char *)&local_188;
          url_00._M_len = local_280._0_8_;
          local_390 = &local_380;
          aux::parse_url_components_abi_cxx11_
                    ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_370,(aux *)local_280._8_8_,url_00,ec_00);
          local_2d8 = &local_208;
          p_Stack_2e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8;
          local_2e8 = (undefined1  [8])(local_1e8 + 8);
          local_2d0 = &local_2c0;
          local_2c8 = &local_390;
          ::std::
          tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
          ::operator=((tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
                       *)local_2e8,
                      (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_370);
          ::std::
          _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_370);
          if (local_1e8._0_4_ == -1) {
            iVar9 = ::std::__cxx11::string::compare((char *)&local_390);
            local_1e8._0_4_ = 0x1bb;
            if (iVar9 == 0) {
              local_1e8._0_4_ = 0x50;
            }
          }
          if (local_184 == '\x01') {
            iVar9 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
            if ((char)iVar9 != '\0') {
              aux::print_endpoint_abi_cxx11_((string *)local_370,(aux *)&local_3b8,ep_04);
              (*(local_180->super_error_category)._vptr_error_category[4])
                        (local_2e8,local_180,(ulong)local_188);
              log(this,(double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
              if (local_2e8 != (undefined1  [8])&local_2d8) {
                operator_delete((void *)local_2e8,(long)local_2d8 + 1);
              }
LAB_0038f0e4:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_370._0_8_ != &aStack_360) {
                operator_delete((void *)local_370._0_8_,
                                CONCAT44(aStack_360._M_allocated_capacity._4_4_,
                                         aStack_360._M_allocated_capacity._0_4_) + 1);
              }
            }
          }
          else {
            iVar9 = ::std::__cxx11::string::compare((char *)&local_390);
            if (iVar9 == 0) {
              ppVar3 = this->m_callback;
              if (local_1e8._0_4_ == 0) {
                iVar9 = (*ppVar3->_vptr_portmap_callback[1])(ppVar3,1);
                if ((char)iVar9 != '\0') {
                  aux::print_endpoint_abi_cxx11_((string *)local_370,(aux *)&local_3b8,ep_06);
                  log(this,(double)CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_09));
                  goto LAB_0038f0e4;
                }
              }
              else {
                iVar9 = (*ppVar3->_vptr_portmap_callback[1])(ppVar3,1);
                if ((char)iVar9 != '\0') {
                  log(this,(double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
                }
                if ((this->m_devices)._M_t._M_impl.super__Rb_tree_header._M_node_count < 0x32) {
                  pgVar4 = (this->m_mappings).
                           super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                           .
                           super__Vector_base<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  for (pgVar12 = (this->m_mappings).
                                 super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                                 .
                                 super__Vector_base<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start; pgVar12 != pgVar4;
                      pgVar12 = pgVar12 + 1) {
                    local_370._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    stack0xfffffffffffffc99 = (uint7)((ulong)unique0x100012e2 >> 8) & 0xffffff;
                    aStack_360._M_allocated_capacity._0_4_ =
                         aStack_360._M_allocated_capacity._0_4_ & 0xffffff00;
                    local_340._M_p = local_338 + 8;
                    local_338._0_8_ = 0;
                    local_338[8] = '\0';
                    local_320 = 0;
                    local_370[8] = 1;
                    uVar5 = *(undefined8 *)&(pgVar12->local_ep).impl_.data_;
                    uVar6 = *(undefined8 *)((long)&(pgVar12->local_ep).impl_.data_ + 8);
                    _Stack_348._M_p = *(pointer *)((long)&(pgVar12->local_ep).impl_.data_ + 0x14);
                    uStack_34c = (undefined4)
                                 ((ulong)*(undefined8 *)
                                          ((long)&(pgVar12->local_ep).impl_.data_ + 0xc) >> 0x20);
                    aStack_360._M_allocated_capacity._4_4_ = (undefined4)uVar5;
                    aStack_360._8_4_ = (undefined4)((ulong)uVar5 >> 0x20);
                    aStack_360._12_4_ = (undefined4)uVar6;
                    _Stack_350._M_head_impl = (int)((ulong)uVar6 >> 0x20);
                    ::std::__cxx11::string::_M_assign((string *)&local_340);
                    iStack_364 = pgVar12->external_port;
                    aStack_360._M_local_buf[0] = pgVar12->protocol;
                    ::std::
                    vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>
                    ::push_back(&local_220,(value_type *)local_370);
                    if (local_340._M_p != local_338 + 8) {
                      operator_delete(local_340._M_p,CONCAT71(local_338._9_7_,local_338[8]) + 1);
                    }
                  }
                  ::std::
                  _Rb_tree<libtorrent::upnp::rootdevice,libtorrent::upnp::rootdevice,std::_Identity<libtorrent::upnp::rootdevice>,std::less<libtorrent::upnp::rootdevice>,std::allocator<libtorrent::upnp::rootdevice>>
                  ::_M_insert_unique<libtorrent::upnp::rootdevice_const&>
                            ((_Rb_tree<libtorrent::upnp::rootdevice,libtorrent::upnp::rootdevice,std::_Identity<libtorrent::upnp::rootdevice>,std::less<libtorrent::upnp::rootdevice>,std::allocator<libtorrent::upnp::rootdevice>>
                              *)&this->m_devices,(rootdevice *)local_280);
                  if (local_2c0 != &local_2b0) {
                    operator_delete(local_2c0,CONCAT71(uStack_2af,local_2b0) + 1);
                  }
                  if (local_390 != &local_380) {
                    operator_delete(local_390,CONCAT71(uStack_37f,local_380) + 1);
                  }
                  goto LAB_0038ec78;
                }
                iVar9 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
                if ((char)iVar9 != '\0') {
                  log(this,(double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08));
                }
              }
            }
            else {
              iVar9 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
              if ((char)iVar9 != '\0') {
                aux::print_endpoint_abi_cxx11_((string *)local_370,(aux *)&local_3b8,ep_05);
                log(this,(double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
                goto LAB_0038f0e4;
              }
            }
          }
          if (local_2c0 != &local_2b0) {
            operator_delete(local_2c0,CONCAT71(uStack_2af,local_2b0) + 1);
          }
          if (local_390 != &local_380) {
            operator_delete(local_390,CONCAT71(uStack_37f,local_380) + 1);
          }
        }
        else {
LAB_0038ec78:
          try_map_upnp(this);
          local_370._0_8_ = (pointer)0x3b9aca00;
          boost::asio::
          basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
          ::expires_after(&this->m_map_timer,(duration *)local_370);
          ::std::__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<libtorrent::upnp,void>
                    ((__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2> *)local_2e8,
                     (__weak_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2> *)this);
          local_370._0_8_ = map_timer;
          stack0xfffffffffffffc98 = 0;
          aStack_360._M_allocated_capacity._0_4_ = local_2e8._0_4_;
          aStack_360._M_allocated_capacity._4_4_ = local_2e8._4_4_;
          aStack_360._8_4_ = SUB84(p_Stack_2e0,0);
          aStack_360._12_4_ = (undefined4)((ulong)p_Stack_2e0 >> 0x20);
          local_2e8 = (undefined1  [8])0x0;
          p_Stack_2e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          boost::asio::detail::
          deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
          ::
          async_wait<std::_Bind<void(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,std::_Placeholder<1>))(boost::system::error_code_const&)>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                    ((deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
                      *)(this->m_map_timer).impl_.service_,
                     &(this->m_map_timer).impl_.implementation_,
                     (_Bind<void_(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                      *)local_370,&(this->m_map_timer).impl_.executor_);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT44(aStack_360._12_4_,aStack_360._8_4_) !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT44(aStack_360._12_4_,aStack_360._8_4_));
          }
          if (p_Stack_2e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_2e0);
          }
        }
        rootdevice::~rootdevice((rootdevice *)local_280);
      }
      puVar13 = local_2a0;
      if (local_2a0 != local_290) goto LAB_0038f15d;
    }
    else {
      iVar9 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
      if ((char)iVar9 != '\0') {
        aux::print_endpoint_abi_cxx11_((string *)local_280,(aux *)&local_3b8,ep_02);
        log(this,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
        goto LAB_0038f069;
      }
    }
  }
  else {
    iVar9 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
    if ((char)iVar9 != '\0') {
      if (local_148._8_8_ == 0) {
        aux::print_endpoint_abi_cxx11_((string *)local_280,(aux *)&local_3b8,ep_00);
        log(this,(double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
      }
      else {
        aux::print_endpoint_abi_cxx11_((string *)local_280,(aux *)&local_3b8,ep_00);
        log(this,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      }
      goto LAB_0038f069;
    }
  }
  aux::http_parser::~http_parser((http_parser *)local_150);
LAB_0038f172:
  aux::
  scope_end_impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/upnp.cpp:481:35)>
  ::~scope_end_impl(&local_178);
  if (local_158 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_158);
  }
  return;
}

Assistant:

void upnp::on_reply(aux::socket_package& s, error_code const& ec, std::size_t const len)
{
	TORRENT_ASSERT(is_single_thread());
	COMPLETE_ASYNC("upnp::on_reply");

	if (ec == boost::asio::error::operation_aborted) return;
	if (m_closing) return;

	std::shared_ptr<upnp> me(self());
	udp::endpoint const from = s.remote;
	// parse out the url for the device

/*
	the response looks like this:

	HTTP/1.1 200 OK
	ST:upnp:rootdevice
	USN:uuid:000f-66d6-7296000099dc::upnp:rootdevice
	Location: http://192.168.1.1:5431/dyndev/uuid:000f-66d6-7296000099dc
	Server: Custom/1.0 UPnP/1.0 Proc/Ver
	EXT:
	Cache-Control:max-age=180
	DATE: Fri, 02 Jan 1970 08:10:38 GMT

	a notification looks like this:

	NOTIFY * HTTP/1.1
	Host:239.255.255.250:1900
	NT:urn:schemas-upnp-org:device:MediaServer:1
	NTS:ssdp:alive
	Location:http://10.0.3.169:2869/upnphost/udhisapi.dll?content=uuid:c17f0c32-d19b-4938-ae94-65f945c3a26e
	USN:uuid:c17f0c32-d19b-4938-ae94-65f945c3a26e::urn:schemas-upnp-org:device:MediaServer:1
	Cache-Control:max-age=900
	Server:Microsoft-Windows-NT/5.1 UPnP/1.0 UPnP-Device-Host/1.0

*/

	// reissue the async receive as we exit the function. We can't do this
	// earlier because we still need to use s.buffer
	auto reissue_receive = scope_end([&] {
		ADD_OUTSTANDING_ASYNC("upnp::on_reply");
		s.socket.async_receive_from(boost::asio::buffer(s.buffer), s.remote
			, std::bind(&upnp::on_reply, self(), std::ref(s), _1, _2));
	});

	if (ec) return;

	if (m_settings.get_bool(settings_pack::upnp_ignore_nonrouters)
		&& !match_addr_mask(m_listen_address, from.address(), m_netmask))
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("ignoring response from: %s. IP is not on local network. (addr: %s mask: %s)"
				, print_endpoint(from).c_str()
				, m_listen_address.to_string().c_str()
				, m_netmask.to_string().c_str());
		}
#endif
		return;
	}

	aux::http_parser p;
	bool error = false;
	p.incoming({s.buffer.data(), std::ptrdiff_t(len)}, error);
	if (error)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("received malformed HTTP from: %s"
				, print_endpoint(from).c_str());
		}
#endif
		return;
	}

	if (p.status_code() != 200 && p.method() != "notify")
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			if (p.method().empty())
			{
				log("HTTP status %u from %s"
					, p.status_code(), print_endpoint(from).c_str());
			}
			else
			{
				log("HTTP method %s from %s"
					, p.method().c_str(), print_endpoint(from).c_str());
			}
		}
#endif
		return;
	}

	if (!p.header_finished())
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("incomplete HTTP packet from %s"
				, print_endpoint(from).c_str());
		}
#endif
		return;
	}

	std::string url = p.header("location");
	if (url.empty())
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("missing location header from %s"
				, print_endpoint(from).c_str());
		}
#endif
		return;
	}

	rootdevice d;
	d.url = url;

	auto i = m_devices.find(d);

	if (i == m_devices.end())
	{
		std::string protocol;
		std::string auth;
		error_code err;
		// we don't have this device in our list. Add it
		std::tie(protocol, auth, d.hostname, d.port, d.path)
			= parse_url_components(d.url, err);
		if (d.port == -1) d.port = protocol == "http" ? 80 : 443;

		if (err)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				log("invalid URL %s from %s: %s"
					, d.url.c_str(), print_endpoint(from).c_str(), err.message().c_str());
			}
#endif
			return;
		}

		// ignore the auth here. It will be re-parsed
		// by the http connection later

		if (protocol != "http")
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				log("unsupported protocol %s from %s"
					, protocol.c_str(), print_endpoint(from).c_str());
			}
#endif
			return;
		}

		if (d.port == 0)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				log("URL with port 0 from %s", print_endpoint(from).c_str());
			}
#endif
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("found rootdevice: %s (%d)"
				, d.url.c_str(), int(m_devices.size()));
		}
#endif

		if (m_devices.size() >= 50)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				log("too many rootdevices: (%d). Ignoring %s"
					, int(m_devices.size()), d.url.c_str());
			}
#endif
			return;
		}

		TORRENT_ASSERT(d.mapping.empty());
		for (auto const& j : m_mappings)
		{
			mapping_t m;
			m.act = portmap_action::add;
			m.local_ep = j.local_ep;
			m.device = j.device;
			m.external_port = j.external_port;
			m.protocol = j.protocol;
			d.mapping.push_back(m);
		}
		std::tie(i, std::ignore) = m_devices.insert(d);
	}


	// iterate over the devices we know and connect and issue the mappings
	try_map_upnp();

	// check back in a little bit to see if we have seen any
	// devices at one of our default routes. If not, we want to override
	// ignoring them and use them instead (better than not working).
	m_map_timer.expires_after(seconds(1));
	ADD_OUTSTANDING_ASYNC("upnp::map_timer");
	m_map_timer.async_wait(std::bind(&upnp::map_timer, self(), _1));
}